

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

optional<tinyusdz::Token> * __thiscall
tinyusdz::primvar::PrimVar::get_ts_value<tinyusdz::Token>
          (optional<tinyusdz::Token> *__return_storage_ptr__,PrimVar *this,size_t idx)

{
  ulong *puVar1;
  optional<tinyusdz::value::Value> pv;
  undefined1 local_58 [8];
  storage_t<tinyusdz::Token> local_50;
  char local_30;
  storage_union local_28;
  ulong local_18;
  
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
  }
  else {
    tinyusdz::value::TimeSamples::get_value
              ((optional<tinyusdz::value::Value> *)local_58,&this->_ts,idx);
    local_30 = local_58[0];
    if ((local_58[0] == true) && (local_18 = local_50._16_8_, local_50._16_8_ != 0)) {
      (**(code **)(local_50._16_8_ + 0x30))((storage_union *)(local_58 + 8),&local_28);
      local_50._16_8_ = 0;
    }
    if ((local_58[0] == true) && (local_50._16_8_ != 0)) {
      (**(code **)(local_50._16_8_ + 0x20))((storage_union *)(local_58 + 8));
      local_50._16_8_ = 0;
    }
    if (local_30 == '\0') {
      __return_storage_ptr__->has_value_ = false;
      *(undefined8 *)&__return_storage_ptr__->contained = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    }
    else {
      tinyusdz::value::Value::get_value<tinyusdz::Token>
                ((optional<tinyusdz::Token> *)local_58,(Value *)&local_28,false);
      __return_storage_ptr__->has_value_ = local_58[0];
      if (local_58[0] == true) {
        puVar1 = (ulong *)((long)&__return_storage_ptr__->contained + 0x10);
        *(ulong **)&__return_storage_ptr__->contained = puVar1;
        if (local_50.data.__align == (anon_struct_8_0_00000001_for___align)((long)local_58 + 0x18))
        {
          *puVar1 = local_50._16_8_;
          *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_50._24_8_;
        }
        else {
          *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
               local_50.data.__align;
          *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_50._16_8_;
        }
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_50._8_8_;
        local_50._8_8_ = 0;
        local_50._16_8_ = local_50._16_8_ & 0xffffffffffffff00;
        local_50.data._0_8_ = (undefined8)((long)local_58 + 0x18);
      }
    }
    if ((local_30 == '\x01') && (local_18 != 0)) {
      (**(code **)(local_18 + 0x20))(&local_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_ts_value(size_t idx) const {

    if (!has_timesamples()) {
      return nonstd::nullopt;
    }

    nonstd::optional<value::Value> pv = _ts.get_value(idx);
    if (!pv) {
      return nonstd::nullopt;
    }

    return pv.value().get_value<T>();
  }